

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O1

int LogL16Encode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  int iVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  undefined6 in_register_0000000a;
  uint8_t *puVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  uint8_t *puVar14;
  ulong uVar15;
  bool bVar16;
  
  if ((int)CONCAT62(in_register_0000000a,s) != 0) {
    __assert_fail("s == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1bf,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  puVar6 = tif->tif_data;
  if (puVar6 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_luv.c"
                  ,0x1c0,"int LogL16Encode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar2 = cc / (long)*(int *)(puVar6 + 0xc);
  puVar14 = bp;
  if (*(int *)(puVar6 + 4) != 1) {
    if (*(long *)(puVar6 + 0x18) < lVar2) {
      TIFFErrorExtR(tif,"LogL16Encode","Translation buffer too short");
      return 0;
    }
    puVar14 = *(uint8_t **)(puVar6 + 0x10);
    (**(code **)(puVar6 + 0x20))(puVar6,bp,lVar2);
  }
  lVar3 = tif->tif_rawdatasize - tif->tif_rawcc;
  puVar6 = tif->tif_rawcp;
  uVar8 = 0;
  iVar5 = 8;
  do {
    if (0 < lVar2) {
      bVar4 = (byte)iVar5;
      uVar12 = 0xff << (bVar4 & 0x1f);
      lVar7 = 0;
      do {
        if (lVar3 < 4) {
          tif->tif_rawcp = puVar6;
          tif->tif_rawcc = tif->tif_rawdatasize - lVar3;
          iVar1 = TIFFFlushData1(tif);
          if (iVar1 == 0) {
            return 0;
          }
          puVar6 = tif->tif_rawcp;
          lVar3 = tif->tif_rawdatasize - tif->tif_rawcc;
        }
        for (lVar13 = lVar7; lVar13 < lVar2; lVar13 = lVar13 + (uVar8 & 0xffffffff)) {
          uVar8 = 1;
          do {
            if ((lVar2 <= (long)(lVar13 + uVar8)) ||
               (((int)(short)*(ushort *)((long)(puVar14 + lVar13 * 2) + uVar8 * 2) & uVar12) !=
                (int)(short)(*(ushort *)(puVar14 + lVar13 * 2) & (ushort)uVar12)))
            goto LAB_002ad3b2;
            uVar8 = uVar8 + 1;
          } while (uVar8 != 0x81);
          uVar8 = 0x81;
LAB_002ad3b2:
          if (3 < (uint)uVar8) break;
        }
        if ((lVar13 - lVar7 & 0xfffffffffffffffeU) == 2) {
          uVar9 = (uint)(short)(*(ushort *)(puVar14 + lVar7 * 2) & (ushort)uVar12);
          lVar11 = lVar7 + 1;
          do {
            if (((int)*(short *)(puVar14 + lVar11 * 2) & uVar12) != uVar9) goto LAB_002ad4bb;
            lVar11 = lVar11 + 1;
          } while (lVar13 != lVar11);
          *puVar6 = ~(byte)lVar7 + (char)lVar13 + '\x7f';
          puVar6[1] = (uint8_t)(uVar9 >> (bVar4 & 0x1f));
          puVar6 = puVar6 + 2;
          lVar3 = lVar3 + -2;
          lVar7 = lVar13;
        }
LAB_002ad4bb:
        while (lVar7 < lVar13) {
          uVar15 = lVar13 - lVar7;
          if (0x7e < (long)uVar15) {
            uVar15 = 0x7f;
          }
          if (lVar3 < (long)(uVar15 + 3)) {
            tif->tif_rawcp = puVar6;
            tif->tif_rawcc = tif->tif_rawdatasize - lVar3;
            iVar1 = TIFFFlushData1(tif);
            if (iVar1 == 0) {
              return 0;
            }
            puVar6 = tif->tif_rawcp;
            lVar3 = tif->tif_rawdatasize - tif->tif_rawcc;
          }
          *puVar6 = (uint8_t)uVar15;
          puVar6 = puVar6 + 1;
          uVar10 = uVar15;
          if (lVar13 == lVar7) {
            lVar3 = lVar3 + -1;
          }
          else {
            do {
              lVar11 = lVar7 * 2;
              lVar7 = lVar7 + 1;
              *puVar6 = (uint8_t)((int)*(short *)(puVar14 + lVar11) >> (bVar4 & 0x1f));
              puVar6 = puVar6 + 1;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            lVar3 = lVar3 + ~uVar15;
          }
        }
        if ((int)uVar8 < 4) {
          uVar8 = 0;
        }
        else {
          *puVar6 = (char)uVar8 + '~';
          puVar6[1] = (uint8_t)((int)*(short *)(puVar14 + lVar13 * 2) >> (bVar4 & 0x1f));
          puVar6 = puVar6 + 2;
          lVar3 = lVar3 + -2;
        }
        lVar7 = lVar7 + (uVar8 & 0xffffffff);
      } while (lVar7 < lVar2);
    }
    bVar16 = iVar5 == 0;
    iVar5 = iVar5 + -8;
    if (bVar16) {
      tif->tif_rawcp = puVar6;
      tif->tif_rawcc = tif->tif_rawdatasize - lVar3;
      return 1;
    }
  } while( true );
}

Assistant:

static int LogL16Encode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    static const char module[] = "LogL16Encode";
    LogLuvState *sp = EncoderState(tif);
    int shft;
    tmsize_t i;
    tmsize_t j;
    tmsize_t npixels;
    uint8_t *op;
    int16_t *tp;
    int16_t b;
    tmsize_t occ;
    int rc = 0, mask;
    tmsize_t beg;

    (void)s;
    assert(s == 0);
    assert(sp != NULL);
    npixels = cc / sp->pixel_size;

    if (sp->user_datafmt == SGILOGDATAFMT_16BIT)
        tp = (int16_t *)bp;
    else
    {
        tp = (int16_t *)sp->tbuf;
        if (sp->tbuflen < npixels)
        {
            TIFFErrorExtR(tif, module, "Translation buffer too short");
            return (0);
        }
        (*sp->tfunc)(sp, bp, npixels);
    }
    /* compress each byte string */
    op = tif->tif_rawcp;
    occ = tif->tif_rawdatasize - tif->tif_rawcc;
    for (shft = 8; shft >= 0; shft -= 8)
    {
        for (i = 0; i < npixels; i += rc)
        {
            if (occ < 4)
            {
                tif->tif_rawcp = op;
                tif->tif_rawcc = tif->tif_rawdatasize - occ;
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
                occ = tif->tif_rawdatasize - tif->tif_rawcc;
            }
            mask = 0xff << shft; /* find next run */
            for (beg = i; beg < npixels; beg += rc)
            {
                b = (int16_t)(tp[beg] & mask);
                rc = 1;
                while (rc < 127 + 2 && beg + rc < npixels &&
                       (tp[beg + rc] & mask) == b)
                    rc++;
                if (rc >= MINRUN)
                    break; /* long enough */
            }
            if (beg - i > 1 && beg - i < MINRUN)
            {
                b = (int16_t)(tp[i] & mask); /*check short run */
                j = i + 1;
                while ((tp[j++] & mask) == b)
                    if (j == beg)
                    {
                        *op++ = (uint8_t)(128 - 2 + j - i);
                        *op++ = (uint8_t)(b >> shft);
                        occ -= 2;
                        i = beg;
                        break;
                    }
            }
            while (i < beg)
            { /* write out non-run */
                if ((j = beg - i) > 127)
                    j = 127;
                if (occ < j + 3)
                {
                    tif->tif_rawcp = op;
                    tif->tif_rawcc = tif->tif_rawdatasize - occ;
                    if (!TIFFFlushData1(tif))
                        return (0);
                    op = tif->tif_rawcp;
                    occ = tif->tif_rawdatasize - tif->tif_rawcc;
                }
                *op++ = (uint8_t)j;
                occ--;
                while (j--)
                {
                    *op++ = (uint8_t)(tp[i++] >> shft & 0xff);
                    occ--;
                }
            }
            if (rc >= MINRUN)
            { /* write out run */
                *op++ = (uint8_t)(128 - 2 + rc);
                *op++ = (uint8_t)(tp[beg] >> shft & 0xff);
                occ -= 2;
            }
            else
                rc = 0;
        }
    }
    tif->tif_rawcp = op;
    tif->tif_rawcc = tif->tif_rawdatasize - occ;

    return (1);
}